

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

uint nullcGetCurrentExecutor(void **exec)

{
  undefined8 local_20;
  undefined8 local_18;
  void **exec_local;
  
  if (exec != (void **)0x0) {
    if (NULLC::currExec == 1) {
      local_18 = NULLC::executorX86;
    }
    else {
      if (NULLC::currExec == 2) {
        local_20 = NULLC::executorLLVM;
      }
      else {
        local_20 = NULLC::executorRegVm;
      }
      local_18 = local_20;
    }
    *exec = local_18;
  }
  return NULLC::currExec;
}

Assistant:

unsigned int nullcGetCurrentExecutor(void **exec)
{
	using namespace NULLC;

#if !defined(NULLC_NO_EXECUTOR)
	if(exec)
		*exec = currExec == NULLC_X86 ? (void*)executorX86 : (currExec == NULLC_LLVM ? (void*)executorLLVM : (void*)executorRegVm);
#else
	*exec = NULL;
#endif

	return currExec;
}